

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding_util_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::EncodingUtilTest_TestDecodeNegativePrices_Test::TestBody
          (EncodingUtilTest_TestDecodeNegativePrices_Test *this)

{
  bool bVar1;
  char *pcVar2;
  double dVar3;
  AssertHelper local_e8;
  Message local_e0;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_5;
  Message local_c0;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_4;
  Message local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_3;
  Message local_80;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_2;
  Message local_60;
  undefined1 local_58 [8];
  AssertionResult gtest_ar_1;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  int32_t scale;
  EncodingUtilTest_TestDecodeNegativePrices_Test *this_local;
  
  gtest_ar.message_.ptr_._4_4_ = 8;
  dVar3 = (double)bidfx_public_api::price::pixie::EncodingUtil::DecodeDecimal(-0x17fccde60,8);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_28,"-64.391","EncodingUtil::DecodeDecimal(-6439100000L, scale)",
             "DELTA",-64.391,dVar3,(this->super_EncodingUtilTest).DELTA);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/encoding_util_test.cpp"
               ,0x2a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  dVar3 = (double)bidfx_public_api::price::pixie::EncodingUtil::DecodeDecimal
                            (-0x26612260,gtest_ar.message_.ptr_._4_4_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_58,"-6.439","EncodingUtil::DecodeDecimal(-643900000L, scale)","DELTA"
             ,-6.439,dVar3,(this->super_EncodingUtilTest).DELTA);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_60);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/encoding_util_test.cpp"
               ,0x2b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  dVar3 = (double)bidfx_public_api::price::pixie::EncodingUtil::DecodeDecimal
                            (-6410000000,gtest_ar.message_.ptr_._4_4_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_78,"-64.1","EncodingUtil::DecodeDecimal(-6410000000L, scale)","DELTA"
             ,-64.1,dVar3,(this->super_EncodingUtilTest).DELTA);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/encoding_util_test.cpp"
               ,0x2c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  dVar3 = (double)bidfx_public_api::price::pixie::EncodingUtil::DecodeDecimal
                            (-6499999999,gtest_ar.message_.ptr_._4_4_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_98,"-64.99999999","EncodingUtil::DecodeDecimal(-6499999999L, scale)",
             "DELTA",-64.99999999,dVar3,(this->super_EncodingUtilTest).DELTA);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/encoding_util_test.cpp"
               ,0x2d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  dVar3 = (double)bidfx_public_api::price::pixie::EncodingUtil::DecodeDecimal
                            (-0x17d784001,gtest_ar.message_.ptr_._4_4_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_b8,"-64.00000001","EncodingUtil::DecodeDecimal(-6400000001L, scale)",
             "DELTA",-64.00000001,dVar3,(this->super_EncodingUtilTest).DELTA);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/encoding_util_test.cpp"
               ,0x2e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  dVar3 = (double)bidfx_public_api::price::pixie::EncodingUtil::DecodeDecimal
                            (-0x8ae03f0,gtest_ar.message_.ptr_._4_4_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_d8,"-1.45622","EncodingUtil::DecodeDecimal(-145622000L, scale)",
             "DELTA",-1.45622,dVar3,(this->super_EncodingUtilTest).DELTA);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/encoding_util_test.cpp"
               ,0x2f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  return;
}

Assistant:

TEST_F(EncodingUtilTest, TestDecodeNegativePrices)
{
    int32_t scale = 8;
    EXPECT_NEAR(-64.391, EncodingUtil::DecodeDecimal(-6439100000L, scale), DELTA);
    EXPECT_NEAR(-6.439, EncodingUtil::DecodeDecimal(-643900000L, scale), DELTA);
    EXPECT_NEAR(-64.1, EncodingUtil::DecodeDecimal(-6410000000L, scale), DELTA);
    EXPECT_NEAR(-64.99999999, EncodingUtil::DecodeDecimal(-6499999999L, scale), DELTA);
    EXPECT_NEAR(-64.00000001, EncodingUtil::DecodeDecimal(-6400000001L, scale), DELTA);
    EXPECT_NEAR(-1.45622, EncodingUtil::DecodeDecimal(-145622000L, scale), DELTA);
}